

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  pointer pbVar1;
  t_TestingHandlers *ptVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  cmCTest *this_00;
  bool SRArgumentSpecified;
  ulong local_238;
  uint local_22c;
  cmCTest *local_228;
  uint local_220;
  int local_21c;
  string *local_218;
  string *local_210;
  string errormsg;
  char *local_1e8 [4];
  string arg;
  string targ;
  
  SRArgumentSpecified = false;
  local_218 = output;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->InitialCommandLineArguments,
             (this->InitialCommandLineArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  local_210 = &this->ScheduleType;
  ptVar2 = &this->TestingHandlers;
  local_22c = (uint)CONCAT71((int7)((ulong)local_210 >> 8),1);
  local_238 = 1;
  local_220 = 0;
  local_228 = this;
  do {
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= local_238) {
      if (this->ParallelLevelSetInCli == false) {
        targ._M_dataplus._M_p = (pointer)&targ.field_2;
        targ._M_string_length = 0;
        targ.field_2._M_local_buf[0] = '\0';
        bVar3 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",&targ);
        if (bVar3) {
          iVar7 = atoi(targ._M_dataplus._M_p);
          iVar6 = 1;
          if (1 < iVar7) {
            iVar6 = iVar7;
          }
          this->ParallelLevel = iVar6;
        }
        std::__cxx11::string::~string((string *)&targ);
      }
      if ((local_220 & 1) == 0) {
        if ((local_22c & 1) == 0) {
          iVar6 = 1;
        }
        else {
          iVar6 = ExecuteTests(this);
        }
      }
      else {
        iVar6 = RunCMakeAndTest(this,local_218);
      }
      return iVar6;
    }
    errormsg._M_dataplus._M_p = (pointer)&errormsg.field_2;
    errormsg._M_string_length = 0;
    errormsg.field_2._M_local_buf[0] = '\0';
    bVar3 = HandleCommandLineArguments(this,&local_238,args,&errormsg);
    if (bVar3) {
      HandleScriptArguments(this,&local_238,args,&SRArgumentSpecified);
      this_00 = (cmCTest *)&arg;
      std::__cxx11::string::string
                ((string *)&arg,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_238));
      bVar3 = CheckArgument(this_00,&arg,"-D","--dashboard");
      if ((bVar3) &&
         (pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         local_238 <
         ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U)) {
        this->ProduceXML = true;
        local_238 = local_238 + 1;
        std::__cxx11::string::string((string *)&targ,(string *)(pbVar1 + local_238));
        bVar3 = AddTestsForDashboardType(this,&targ);
        if (!bVar3) {
          bVar3 = AddVariableDefinition(this,&targ);
          if (!bVar3) {
            ErrorMessageUnknownDashDValue(this,&targ);
            local_22c = 0;
          }
        }
        std::__cxx11::string::~string((string *)&targ);
      }
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &arg,"-D");
      if ((bVar3) &&
         (bVar3 = cmsys::SystemTools::StringStartsWith(arg._M_dataplus._M_p,"-D"), this = local_228,
         bVar3)) {
        std::__cxx11::string::substr((ulong)&targ,(ulong)&arg);
        AddVariableDefinition(this,&targ);
        std::__cxx11::string::~string((string *)&targ);
      }
      bVar4 = HandleTestActionArgument(this,"ctest",&local_238,args);
      bVar5 = HandleTestModelArgument(local_228,"ctest",&local_238,args);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &arg,"--extra-submit");
      if ((bVar3) &&
         (local_238 <
          ((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
        local_228->ProduceXML = true;
        SetTest(local_228,"Submit",true);
        local_238 = local_238 + 1;
        bVar3 = SubmitExtraFiles(local_228,
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[local_238]._M_dataplus.
                                 _M_p);
        if (bVar3) goto LAB_002df996;
LAB_002dfaaf:
        bVar3 = false;
        local_21c = 0;
      }
      else {
LAB_002df996:
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&arg,"--build-and-test");
        if (bVar3) {
          local_220 = CONCAT31((int3)(local_220 >> 8),
                               (byte)local_220 |
                               local_238 <
                               ((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&arg,"--schedule-random");
        if (bVar3) {
          std::__cxx11::string::assign((char *)local_210);
        }
        for (p_Var8 = (local_228->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left;
            (_Rb_tree_header *)p_Var8 != &(ptVar2->_M_t)._M_impl.super__Rb_tree_header;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          iVar6 = (**(code **)(**(long **)(p_Var8 + 2) + 0x10))
                            (*(long **)(p_Var8 + 2),(cmCTest *)&arg,&local_238,args);
          if (iVar6 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
            std::operator<<((ostream *)&targ,
                            "Problem parsing command line arguments within a handler");
            std::__cxx11::stringbuf::str();
            Log(local_228,6,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                ,0x840,local_1e8[0],false);
            std::__cxx11::string::~string((string *)local_1e8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targ);
            goto LAB_002dfaaf;
          }
        }
        bVar3 = true;
      }
      local_22c = CONCAT31((int3)(local_22c >> 8),(byte)local_22c & (bVar4 && bVar5));
      std::__cxx11::string::~string((string *)&arg);
      this = local_228;
    }
    else {
      bVar3 = false;
      cmSystemTools::Error(errormsg._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      local_21c = 1;
    }
    std::__cxx11::string::~string((string *)&errormsg);
    if (!bVar3) {
      return local_21c;
    }
    local_238 = local_238 + 1;
  } while( true );
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  this->InitialCommandLineArguments.insert(
    this->InitialCommandLineArguments.end(), args.begin(), args.end());

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg.c_str());
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1) {
      this->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1) {
      this->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i].c_str())) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random")) {
      this->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    cmCTest::t_TestingHandlers::iterator it;
    for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
         ++it) {
      if (!it->second->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}